

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O2

double binary_fuse_calculate_size_factor(uint32_t arity,uint32_t size)

{
  double dVar1;
  
  dVar1 = log((double)arity);
  dVar1 = 3.4538776394910684 / dVar1 + 0.875;
  if (dVar1 <= 1.125) {
    dVar1 = 1.125;
  }
  return dVar1;
}

Assistant:

static inline double binary_fuse_calculate_size_factor(uint32_t arity,
                                                        uint32_t size) {
  if (arity == 3) {
    return binary_fuse_max(1.125, 0.875 + 0.25 * log(1000000.0) / log((double)size));
  } else if (arity == 4) {
    return binary_fuse_max(1.075, 0.77 + 0.305 * log(600000.0) / log((double)size));
  } else {
    return 2.0;
  }
}